

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::dump
          (iterator *this,ostream *os)

{
  long lVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  uint uVar5;
  __extent_storage<18446744073709551615UL> in_RCX;
  ostream *poVar7;
  _Map_pointer ppiVar8;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  undefined1 local_88 [8];
  stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
  tmp;
  __extent_storage<18446744073709551615UL> _Var6;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"keybuf=",7);
    key._M_extent._M_extent_value = in_RCX._M_extent_value;
    key._M_ptr = (pointer)(this->keybuf_).off;
    detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)os,(ostream *)(this->keybuf_).buf,key);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    std::
    deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::deque((deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             *)local_88,&(this->stack_).c);
    if (tmp.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node !=
        (_Map_pointer)
        tmp.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size) {
      do {
        ppiVar8 = tmp.c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            tmp.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            tmp.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          ppiVar8 = (_Map_pointer)
                    (tmp.c.
                     super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].prefix.u64 + 0x1f8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"iter::stack:: level = ",0x16);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", key_byte=0x",0xd);
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
        lVar1 = *(long *)(lVar1 + -0x18);
        poVar7 = poVar4 + lVar1;
        if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
          oVar3 = (ostream)std::ios::widen((char)poVar7);
          poVar7[0xe0] = oVar3;
          poVar7[0xe1] = (ostream)0x1;
        }
        poVar7[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", child_index=0x",0x10);
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
        lVar1 = *(long *)(lVar1 + -0x18);
        poVar7 = poVar4 + lVar1;
        if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
          oVar3 = (ostream)std::ios::widen((char)poVar7);
          poVar7[0xe0] = oVar3;
          poVar7[0xe1] = (ostream)0x1;
        }
        poVar7[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        uVar5 = *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        _Var6._M_extent_value = (size_t)uVar5;
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) = uVar5;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", prefix(",9);
        tmp.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ =
             *(undefined1 *)((long)ppiVar8 + -1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)((long)&tmp.c.
                                                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_node
                                           + 7),1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")=",2);
        key_00._M_ptr = (pointer)(ulong)*(byte *)((long)ppiVar8 + -1);
        key_00._M_extent._M_extent_value = _Var6._M_extent_value;
        detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                  ((detail *)os,(ostream *)(ppiVar8 + -1),key_00);
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        detail::
        basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::dump_node(os,(basic_node_ptr<unodb::detail::node_header> *)(ppiVar8 + -3),false);
        if ((((basic_node_ptr<unodb::detail::node_header> *)(ppiVar8 + -3))->tagged_ptr & 7) != 0) {
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)((long)&tmp.c.
                                        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node + 7),1);
        }
        if ((_Elt_pointer)
            tmp.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            tmp.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          operator_delete(tmp.c.
                          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur,0x1f8);
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].prefix.u64;
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first =
               tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x15;
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node =
               (_Map_pointer)
               (tmp.c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x14);
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last =
               (_Elt_pointer)
               &tmp.c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].prefix;
        }
        else {
          tmp.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node =
               tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node + -3;
        }
      } while (tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node !=
               (_Map_pointer)
               tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size);
    }
    std::
    _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    *)local_88);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"iter::stack:: empty\n",0x14);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream& os) const {
      if (empty()) {
        os << "iter::stack:: empty\n";
        return;
      }
      // Dump the key buffer maintained by the iterator.
      os << "keybuf=";
      detail::dump_key(os, keybuf_.get_key_view());
      os << "\n";
      // Create a new stack and copy everything there.  Using the new
      // stack, print out the stack in top-bottom order.  This avoids
      // modifications to the existing stack for the iterator.
      auto tmp = stack_;
      auto level = tmp.size() - 1;
      while (!tmp.empty()) {
        const auto& e = tmp.top();
        const auto& np = e.node;
        os << "iter::stack:: level = " << level << ", key_byte=0x" << std::hex
           << std::setfill('0') << std::setw(2)
           << static_cast<std::uint64_t>(e.key_byte) << std::dec
           << ", child_index=0x" << std::hex << std::setfill('0')
           << std::setw(2) << static_cast<std::uint64_t>(e.child_index)
           << std::dec << ", prefix(" << e.prefix.length() << ")=";
        detail::dump_key(os, e.prefix.get_key_view());
        os << ", ";
        art_policy::dump_node(os, np, false /*recursive*/);
        if (np.type() != node_type::LEAF) os << '\n';
        tmp.pop();
        level--;
      }
    }